

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_java.cpp
# Opt level: O2

string * __thiscall
flatbuffers::java::JavaGenerator::DestinationCast_abi_cxx11_
          (string *__return_storage_ptr__,JavaGenerator *this,Type *type)

{
  BaseType BVar1;
  char *__s;
  Type local_28;
  
  BVar1 = type->base_type;
  if (BVar1 - BASE_TYPE_ARRAY < 2) {
LAB_001b8786:
    local_28.base_type = type->element;
    local_28.fixed_length = type->fixed_length;
    local_28.element = BASE_TYPE_NONE;
    local_28.struct_def = type->struct_def;
    local_28.enum_def = type->enum_def;
    DestinationCast_abi_cxx11_(__return_storage_ptr__,this,&local_28);
  }
  else {
    if (BVar1 == BASE_TYPE_UINT) {
      __s = "(long)";
    }
    else {
      if (BVar1 == BASE_TYPE_VECTOR) goto LAB_001b8786;
      __s = "";
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,__s,(allocator<char> *)&local_28);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string DestinationCast(const Type &type) const {
    if (IsSeries(type)) {
      return DestinationCast(type.VectorType());
    } else {
      // Cast necessary to correctly read serialized unsigned values.
      if (type.base_type == BASE_TYPE_UINT) return "(long)";
    }
    return "";
  }